

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.h
# Opt level: O3

void __thiscall r_exec::IPGMContext::~IPGMContext(IPGMContext *this)

{
  operator_delete(this);
  return;
}

Assistant:

class REPLICODE_EXPORT IPGMContext:
    public _Context
{
private:
    Code *object; // the object the code belongs to; unchanged when the context is dereferenced to the overlay's value array.
    View *view; // the object's view, can be NULL when the context is dereferenced to a reference_set or a marker_set.

    bool is_cmd_with_cptr() const;

    void addReference(Code *destination, uint16_t write_index, Code *referenced_object) const
    {
        for (uint16_t i = 0; i < destination->references_size(); ++i)
            if (referenced_object == destination->get_reference(i)) {
                destination->code(write_index) = Atom::RPointer(i);
                return;
            }

        destination->add_reference(referenced_object);
        destination->code(write_index) = Atom::RPointer(destination->references_size() - 1);
    }

    void addReference(View *destination, uint16_t write_index, Code *referenced_object) const   // view references are set in order (index 0 then 1).
    {
        uint16_t r_ptr_index;

        if (destination->references[0]) { // first ref already in place.
            r_ptr_index = 1;
        } else {
            r_ptr_index = 0;
        }

        destination->references[r_ptr_index] = referenced_object;
        destination->code(write_index) = Atom::RPointer(r_ptr_index);
    }

    template<class C> void copy_structure(C *destination,
                                          uint16_t write_index,
                                          uint16_t &extent_index,
                                          bool dereference_cptr,
                                          int64_t pgm_index) const   // assumes the context is a structure; C: Object or View.
    {
        if ((*this)[0].getDescriptor() == Atom::OPERATOR && Operator::Get((*this)[0].asOpcode()).is_syn()) { // (\ (expression ...)).
            IPGMContext c = getChild(1);
            c.copy_member(destination, write_index, extent_index, dereference_cptr, pgm_index);
        } else {
            destination->code(write_index++) = (*this)[0];
            uint16_t atom_count = getChildrenCount();
            extent_index = write_index + atom_count;

            switch ((*this)[0].getDescriptor()) {
            case Atom::C_PTR: // copy members as is (no dereference).
                if ((*this)[1].getDescriptor() == Atom::VL_PTR) {
                    Atom a = code[(*this)[1].asIndex()];

                    if (a.getDescriptor() == Atom::I_PTR) {
                        a = code[a.asIndex()];
                    }

                    switch (a.getDescriptor()) {
                    case Atom::OUT_OBJ_PTR:
                        destination->code(write_index++) = Atom::VLPointer(code[(*this)[1].asIndex()].asIndex());
                        break;

                    case Atom::IN_OBJ_PTR: // TMP: assumes destination is a mk.rdx.
                        destination->code(write_index++) = Atom::RPointer(1 + a.asInputIndex());
                        break;

                    default:
                        destination->code(write_index++) = (*this)[1];
                        break;
                    }
                } else {
                    destination->code(write_index++) = (*this)[1];
                }

                for (uint16_t i = 2; i <= atom_count; ++i) {
                    destination->code(write_index++) = (*this)[i];
                }

                break;

            case Atom::TIMESTAMP: // copy members as is (no dereference).
                for (uint16_t i = 1; i <= atom_count; ++i) {
                    destination->code(write_index++) = (*this)[i];
                }

                break;

            default:
                if (is_cmd_with_cptr()) {
                    for (uint16_t i = 1; i <= atom_count; ++i) {
                        IPGMContext c = getChild(i);
                        c.copy_member(destination, write_index++, extent_index, i != 2, pgm_index);
                    }
                } else { // if a pgm is being copied, indicate the starting index of the pgm so that we can turn on code patching and know if a cptr is referencing code inside the pgm (in that case it will not be dereferenced).
                    int64_t _pgm_index;

                    if (pgm_index >= 0) {
                        _pgm_index = pgm_index;
                    } else if ((*this)[0].getDescriptor() == Atom::OBJECT && ((*this)[0].asOpcode() == Opcodes::Pgm || (*this)[0].asOpcode() == Opcodes::AntiPgm)) {
                        _pgm_index = index;
                    } else {
                        _pgm_index = -1;
                    }

                    for (uint16_t i = 1; i <= atom_count; ++i) {
                        IPGMContext c = getChild(i);
                        c.copy_member(destination, write_index++, extent_index, !(!dereference_cptr && i == 1), _pgm_index);
                    }
                }

                break;
            }
        }
    }

    template<class C> void copy_member(C *destination,
                                       uint16_t write_index,
                                       uint16_t &extent_index,
                                       bool dereference_cptr,
                                       int64_t pgm_index) const
    {
        switch ((*this)[0].getDescriptor()) {
        case Atom::I_PTR:
        case Atom::VALUE_PTR:
        case Atom::IPGM_PTR: {
            if (data == REFERENCE && index == 0) { // points to an object, not to one of its members.
                addReference(destination, write_index, object);
                break;
            }

            if (code[(*this)[0].asIndex()].getDescriptor() == Atom::C_PTR) {
                if (!dereference_cptr || (pgm_index > 0 && code[(*this)[0].asIndex() + 1].asIndex() > pgm_index)) { // the latter case occurs when a cptr references code inside a pgm being copied.
                    IPGMContext c = IPGMContext(object, view, code, (*this)[0].asIndex(), (InputLessPGMOverlay *)overlay, data);
                    destination->code(write_index) = Atom::IPointer(extent_index);
                    c.copy_structure(destination, extent_index, extent_index, dereference_cptr, pgm_index);
                    break;
                }
            }

            IPGMContext c = **this;

            if (c[0].isStructural()) {
                destination->code(write_index) = Atom::IPointer(extent_index);

                if (pgm_index > 0 && index > pgm_index && data == STEM) {
                    this->patch_code(index, Atom::OutObjPointer(write_index));
                }

                c.copy_structure(destination, extent_index, extent_index, dereference_cptr, pgm_index);
            } else {
                destination->code(write_index) = c[0];
            }

            break;
        }

        case Atom::VL_PTR:
            switch (code[(*this)[0].asIndex()].getDescriptor()) {
            case Atom::PROD_PTR:
                addReference(destination, write_index, ((InputLessPGMOverlay *)overlay)->productions[code[(*this)[0].asIndex()].asIndex()]);
                break;

            case Atom::I_PTR:
                if (code[code[(*this)[0].asIndex()].asIndex()].getDescriptor() == Atom::IN_OBJ_PTR) {
                    addReference(destination, write_index, ((PGMOverlay *)overlay)->getInputObject(code[code[(*this)[0].asIndex()].asIndex()].asInputIndex()));
                } else {
                    (**this).copy_member(destination, write_index, extent_index, dereference_cptr, pgm_index);
                }

                break;

            case Atom::OUT_OBJ_PTR:
                destination->code(write_index) = Atom::VLPointer(code[(*this)[0].asIndex()].asIndex());
                break;

            case Atom::IN_OBJ_PTR:
            case Atom::D_IN_OBJ_PTR: {
                IPGMContext c = **this;

                if (c.index == 0) {
                    addReference(destination, write_index, c.object);
                } else if (c[0].isStructural()) {
                    destination->code(write_index++) = Atom::IPointer(extent_index);
                    c.copy_structure(destination, extent_index, extent_index, dereference_cptr, pgm_index);
                } else {
                    c.copy_member(destination, write_index, extent_index, dereference_cptr, pgm_index);
                }

                break;
            }

            default:
                (**this).copy_member(destination, write_index, extent_index, dereference_cptr, pgm_index);
                break;
            }

            break;

        case Atom::R_PTR:
            addReference(destination, write_index, object->get_reference((*this)[0].asIndex()));
            break;

        case Atom::PROD_PTR:
            addReference(destination, write_index, ((InputLessPGMOverlay *)overlay)->productions[(*this)[0].asIndex()]);
            break;

        case Atom::IN_OBJ_PTR:
            addReference(destination, write_index, ((PGMOverlay *)overlay)->getInputObject((*this)[0].asIndex()));
            break;

        case Atom::D_IN_OBJ_PTR: {
            IPGMContext c = **this;
            addReference(destination, write_index, c.object);
            break;
        }

        case Atom::OPERATOR:
        case Atom::OBJECT:
        case Atom::MARKER:
        case Atom::INSTANTIATED_PROGRAM:
        case Atom::INSTANTIATED_CPP_PROGRAM:
        case Atom::INSTANTIATED_INPUT_LESS_PROGRAM:
        case Atom::INSTANTIATED_ANTI_PROGRAM:
        case Atom::COMPOSITE_STATE:
        case Atom::MODEL:
        case Atom::GROUP:
        case Atom::SET:
        case Atom::S_SET:
        case Atom::TIMESTAMP:
        case Atom::STRING:
            destination->code(write_index) = Atom::IPointer(extent_index);

            if (pgm_index > 0 && index > pgm_index && data == STEM) {
                this->patch_code(index, Atom::OutObjPointer(write_index));
            }

            copy_structure(destination, extent_index, extent_index, dereference_cptr, pgm_index);
            break;

        case Atom::T_WILDCARD:
            destination->code(write_index) = (*this)[0];
            break;

        default:
            destination->code(write_index) = (*this)[0];

            if (pgm_index > 0 && index > pgm_index && data == STEM) {
                this->patch_code(index, Atom::OutObjPointer(write_index));
            }

            break;
        }
    }

    void copy_structure_to_value_array(bool prefix, uint16_t write_index, uint16_t &extent_index, bool dereference_cptr);
    void copy_member_to_value_array(uint16_t child_index, bool prefix, uint16_t write_index, uint16_t &extent_index, bool dereference_cptr);
public:
    static IPGMContext GetContextFromInput(View *input, InputLessPGMOverlay *overlay)
    {
        return IPGMContext(input->object, input, &input->object->code(0), 0, overlay, REFERENCE);
    }